

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i18n.hpp
# Opt level: O1

string * __thiscall
I18N::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,I18N *this,string *id,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  initializer_list<util::variant> __l;
  vector<util::variant,_std::allocator<util::variant>_> v;
  allocator_type local_111;
  string *local_110;
  vector<util::variant,_std::allocator<util::variant>_> local_108;
  variant local_f0;
  variant local_b0;
  variant local_70;
  
  local_110 = id;
  util::variant::variant(&local_f0,args);
  util::variant::variant(&local_b0,args_1);
  util::variant::variant(&local_70,args_2);
  __l._M_len = 3;
  __l._M_array = &local_f0;
  std::vector<util::variant,_std::allocator<util::variant>_>::vector(&local_108,__l,&local_111);
  lVar2 = -0xc0;
  paVar1 = &local_70.val_string.field_2;
  do {
    if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar1->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar1->_M_allocated_capacity)[-2],paVar1->_M_allocated_capacity + 1
                     );
    }
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar1->_M_allocated_capacity + -8);
    lVar2 = lVar2 + 0x40;
  } while (lVar2 != 0);
  FormatV(__return_storage_ptr__,this,local_110,&local_108);
  std::vector<util::variant,_std::allocator<util::variant>_>::~vector(&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::string Format(const std::string& id, Args&&... args) const
		{
			std::vector<util::variant> v{args...};
			return FormatV(id, std::move(v));
		}